

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O2

Flow * __thiscall
wasm::ExpressionRunner<wasm::ModuleRunner>::visitArrayNew
          (Flow *__return_storage_ptr__,ExpressionRunner<wasm::ModuleRunner> *this,ArrayNew *curr)

{
  ArrayNew *this_00;
  uint uVar1;
  Literal *pLVar2;
  long lVar3;
  ulong initialSize;
  HeapType heapType;
  int64_t iStack_168;
  Field field;
  undefined1 local_158 [8];
  Flow size;
  Literals data;
  Flow init;
  Literal local_88;
  Literal local_70;
  Flow *local_58;
  ArrayNew *local_50;
  undefined1 auStack_48 [8];
  Literal value;
  
  data.super_SmallVector<wasm::Literal,_1UL>.flexible.
  super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  if (*(Expression **)(curr + 0x10) != (Expression *)0x0) {
    visit((Flow *)local_158,this,*(Expression **)(curr + 0x10));
    Flow::operator=((Flow *)&data.super_SmallVector<wasm::Literal,_1UL>.flexible.
                             super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage,(Flow *)local_158);
    SmallVector<wasm::Literal,_1UL>::~SmallVector((SmallVector<wasm::Literal,_1UL> *)local_158);
  }
  visit((Flow *)local_158,this,*(Expression **)(curr + 0x18));
  if (size.breakTo.super_IString.str._M_len == 0) {
    if (*(long *)(curr + 8) == 1) {
      visit(__return_storage_ptr__,this,*(Expression **)(curr + 0x10));
      if ((__return_storage_ptr__->breakTo).super_IString.str._M_str == (char *)0x0) {
        __assert_fail("init.breaking()",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-interpreter.h"
                      ,0x74f,
                      "Flow wasm::ExpressionRunner<wasm::ModuleRunner>::visitArrayNew(ArrayNew *) [SubType = wasm::ModuleRunner]"
                     );
      }
    }
    else {
      this_00 = curr + 8;
      Type::getHeapType((Type *)this_00);
      wasm::HeapType::getArray();
      pLVar2 = Flow::getSingleValue((Flow *)local_158);
      uVar1 = Literal::geti32(pLVar2);
      if (0x2aaaaa9 < uVar1) {
        (*this->_vptr_ExpressionRunner[3])(this,"allocation failure");
      }
      initialSize = (ulong)uVar1;
      SmallVector<wasm::Literal,_1UL>::SmallVector
                ((SmallVector<wasm::Literal,_1UL> *)&size.breakTo.super_IString.str._M_str,
                 initialSize);
      local_58 = __return_storage_ptr__;
      local_50 = this_00;
      if (*(long *)(curr + 0x10) == 0) {
        wasm::Literal::makeZero((Type)auStack_48);
        for (lVar3 = 0; initialSize * 0x18 - lVar3 != 0; lVar3 = lVar3 + 0x18) {
          pLVar2 = (Literal *)
                   ((data.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id - 0x18) +
                   lVar3);
          if (lVar3 == 0) {
            pLVar2 = (Literal *)&data;
          }
          wasm::Literal::operator=(pLVar2,(Literal *)auStack_48);
        }
      }
      else {
        Type::getHeapType((Type *)this_00);
        wasm::HeapType::getArray();
        iStack_168 = (int64_t)auStack_48;
        _field = value.field_0.i64;
        pLVar2 = Flow::getSingleValue
                           ((Flow *)&data.super_SmallVector<wasm::Literal,_1UL>.flexible.
                                     super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
        wasm::Literal::Literal(&local_88,pLVar2);
        truncateForPacking((Literal *)auStack_48,this,&local_88,(Field *)&iStack_168);
        wasm::Literal::~Literal(&local_88);
        for (lVar3 = 0; initialSize * 0x18 - lVar3 != 0; lVar3 = lVar3 + 0x18) {
          pLVar2 = (Literal *)
                   ((data.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id - 0x18) +
                   lVar3);
          if (lVar3 == 0) {
            pLVar2 = (Literal *)&data;
          }
          wasm::Literal::operator=(pLVar2,(Literal *)auStack_48);
        }
      }
      wasm::Literal::~Literal((Literal *)auStack_48);
      makeGCData(&local_70,this,(Literals *)&size.breakTo.super_IString.str._M_str,
                 (Type)*(uintptr_t *)local_50);
      __return_storage_ptr__ = local_58;
      Flow::Flow(local_58,&local_70);
      wasm::Literal::~Literal(&local_70);
      SmallVector<wasm::Literal,_1UL>::~SmallVector
                ((SmallVector<wasm::Literal,_1UL> *)&size.breakTo.super_IString.str._M_str);
    }
  }
  else {
    Flow::Flow(__return_storage_ptr__,(Flow *)local_158);
  }
  SmallVector<wasm::Literal,_1UL>::~SmallVector((SmallVector<wasm::Literal,_1UL> *)local_158);
  SmallVector<wasm::Literal,_1UL>::~SmallVector
            ((SmallVector<wasm::Literal,_1UL> *)
             &data.super_SmallVector<wasm::Literal,_1UL>.flexible.
              super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  return __return_storage_ptr__;
}

Assistant:

Flow visitArrayNew(ArrayNew* curr) {
    NOTE_ENTER("ArrayNew");
    Flow init;
    if (!curr->isWithDefault()) {
      init = self()->visit(curr->init);
      if (init.breaking()) {
        return init;
      }
    }
    auto size = self()->visit(curr->size);
    if (size.breaking()) {
      return size;
    }
    if (curr->type == Type::unreachable) {
      // We cannot proceed to compute the heap type, as there isn't one. Just
      // visit the unreachable child, and stop there.
      auto init = self()->visit(curr->init);
      assert(init.breaking());
      return init;
    }
    auto heapType = curr->type.getHeapType();
    const auto& element = heapType.getArray().element;
    Index num = size.getSingleValue().geti32();
    if (num >= DataLimit) {
      hostLimit("allocation failure");
    }
    Literals data(num);
    if (curr->isWithDefault()) {
      auto zero = Literal::makeZero(element.type);
      for (Index i = 0; i < num; i++) {
        data[i] = zero;
      }
    } else {
      auto field = curr->type.getHeapType().getArray().element;
      auto value = truncateForPacking(init.getSingleValue(), field);
      for (Index i = 0; i < num; i++) {
        data[i] = value;
      }
    }
    return makeGCData(std::move(data), curr->type);
  }